

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtData.h
# Opt level: O0

void __thiscall ProtData::ProtData(ProtData *this,char *filename,bool append_decoy)

{
  byte in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ProtData *in_stack_00000010;
  ProtData *in_stack_00000020;
  char *in_stack_00000298;
  ProtData *in_stack_000002a0;
  
  *in_RDI = in_RSI;
  *(byte *)(in_RDI + 1) = in_DL & 1;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x14c1fe);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x14c211);
  std::vector<PPData::Protein,_std::allocator<PPData::Protein>_>::vector
            ((vector<PPData::Protein,_std::allocator<PPData::Protein>_> *)0x14c224);
  ReadTargetData(in_stack_000002a0,in_stack_00000298);
  BuildTargetProteins(in_stack_00000010);
  if ((in_DL & 1) != 0) {
    BuildDecoy(in_stack_00000020);
  }
  return;
}

Assistant:

ProtData(const char* filename, bool append_decoy) 
            : database_name_(filename), append_decoy_(append_decoy) {
        ReadTargetData(filename);  // read refined fasta into target_data_
        BuildTargetProteins();  // build target proteins into proteins_
        if (append_decoy) {  // build decoy_data_ and append decoys into proteins_
            BuildDecoy();
        }
    }